

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O3

char * imm_bit_name(long *imm_flags)

{
  char *pcVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  
  imm_bit_name::buf[0] = '\0';
  uVar4 = *imm_flags;
  if ((uVar4 & 1) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," summon",8);
    uVar4 = *imm_flags;
  }
  if ((uVar4 & 2) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," cha",4);
    builtin_strncpy(imm_bit_name::buf + sVar3 + 3,"arm",4);
    uVar4 = *imm_flags;
  }
  if ((uVar4 & 4) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," mag",4);
    builtin_strncpy(imm_bit_name::buf + sVar3 + 3,"gic",4);
    uVar4 = *imm_flags;
  }
  if ((uVar4 & 8) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," weapon",8);
    uVar4 = *imm_flags;
  }
  if ((uVar4 & 0x10) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," blu",4);
    builtin_strncpy(imm_bit_name::buf + sVar3 + 3,"unt",4);
    uVar4 = *imm_flags;
  }
  if ((uVar4 & 0x20) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," piercin",8);
    (imm_bit_name::buf + sVar3 + 8)[0] = 'g';
    (imm_bit_name::buf + sVar3 + 8)[1] = '\0';
    uVar4 = *imm_flags;
  }
  uVar2 = (uint)uVar4;
  if ((uVar4 & 0x40) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," slashin",8);
    (imm_bit_name::buf + sVar3 + 8)[0] = 'g';
    (imm_bit_name::buf + sVar3 + 8)[1] = '\0';
    uVar2 = (uint)*imm_flags;
  }
  if ((char)uVar2 < '\0') {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," fir",4);
    (imm_bit_name::buf + sVar3 + 4)[0] = 'e';
    (imm_bit_name::buf + sVar3 + 4)[1] = '\0';
    uVar2 = (uint)*imm_flags;
  }
  if ((uVar2 >> 8 & 1) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," col",4);
    (imm_bit_name::buf + sVar3 + 4)[0] = 'd';
    (imm_bit_name::buf + sVar3 + 4)[1] = '\0';
    uVar2 = (uint)*imm_flags;
  }
  if ((uVar2 >> 9 & 1) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," lightni",8);
    builtin_strncpy(imm_bit_name::buf + sVar3 + 7,"ing",4);
    uVar2 = (uint)*imm_flags;
  }
  if ((uVar2 >> 10 & 1) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," aci",4);
    (imm_bit_name::buf + sVar3 + 4)[0] = 'd';
    (imm_bit_name::buf + sVar3 + 4)[1] = '\0';
    uVar2 = (uint)*imm_flags;
  }
  if ((uVar2 >> 0xb & 1) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," poison",8);
    uVar2 = (uint)*imm_flags;
  }
  if ((uVar2 >> 0xc & 1) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," negativ",8);
    (imm_bit_name::buf + sVar3 + 8)[0] = 'e';
    (imm_bit_name::buf + sVar3 + 8)[1] = '\0';
    uVar2 = (uint)*imm_flags;
  }
  if ((uVar2 >> 0xd & 1) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," hol",4);
    (imm_bit_name::buf + sVar3 + 4)[0] = 'y';
    (imm_bit_name::buf + sVar3 + 4)[1] = '\0';
    uVar2 = (uint)*imm_flags;
  }
  if ((uVar2 >> 0xe & 1) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," energy",8);
    uVar2 = (uint)*imm_flags;
  }
  if ((short)uVar2 < 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," mental",8);
    uVar2 = (uint)*imm_flags;
  }
  if ((uVar2 >> 0x10 & 1) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," disease",8);
    imm_bit_name::buf[sVar3 + 8] = '\0';
    uVar2 = (uint)*imm_flags;
  }
  if ((uVar2 >> 0x11 & 1) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," drownin",8);
    (imm_bit_name::buf + sVar3 + 8)[0] = 'g';
    (imm_bit_name::buf + sVar3 + 8)[1] = '\0';
    uVar2 = (uint)*imm_flags;
  }
  if ((uVar2 >> 0x12 & 1) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," lig",4);
    builtin_strncpy(imm_bit_name::buf + sVar3 + 3,"ght",4);
    uVar2 = (uint)*imm_flags;
  }
  if ((uVar2 >> 0x19 & 1) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," iro",4);
    (imm_bit_name::buf + sVar3 + 4)[0] = 'n';
    (imm_bit_name::buf + sVar3 + 4)[1] = '\0';
    uVar2 = (uint)*imm_flags;
  }
  if ((uVar2 >> 0x17 & 1) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," mithril",8);
    imm_bit_name::buf[sVar3 + 8] = '\0';
    uVar2 = (uint)*imm_flags;
  }
  if ((uVar2 >> 0x18 & 1) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," silver",8);
    uVar2 = (uint)*imm_flags;
  }
  if ((uVar2 >> 0x1a & 1) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," sle",4);
    builtin_strncpy(imm_bit_name::buf + sVar3 + 3,"eep",4);
    uVar2 = (uint)*imm_flags;
  }
  if ((uVar2 >> 0x13 & 1) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," sou",4);
    builtin_strncpy(imm_bit_name::buf + sVar3 + 3,"und",4);
    uVar2 = (uint)*imm_flags;
  }
  if ((uVar2 >> 0x14 & 1) != 0) {
    sVar3 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar3," interna",8);
    (imm_bit_name::buf + sVar3 + 8)[0] = 'l';
    (imm_bit_name::buf + sVar3 + 8)[1] = '\0';
  }
  pcVar1 = imm_bit_name::buf;
  if (imm_bit_name::buf[0] == '\0') {
    pcVar1 = " none";
  }
  return pcVar1 + 1;
}

Assistant:

char *imm_bit_name(long imm_flags[])
{
	static char buf[512];

	buf[0] = '\0';

	if (IS_SET(imm_flags, IMM_SUMMON))
		strcat(buf, " summon");

	if (IS_SET(imm_flags, IMM_CHARM))
		strcat(buf, " charm");

	if (IS_SET(imm_flags, IMM_MAGIC))
		strcat(buf, " magic");

	if (IS_SET(imm_flags, IMM_WEAPON))
		strcat(buf, " weapon");

	if (IS_SET(imm_flags, IMM_BASH))
		strcat(buf, " blunt");

	if (IS_SET(imm_flags, IMM_PIERCE))
		strcat(buf, " piercing");

	if (IS_SET(imm_flags, IMM_SLASH))
		strcat(buf, " slashing");

	if (IS_SET(imm_flags, IMM_FIRE))
		strcat(buf, " fire");

	if (IS_SET(imm_flags, IMM_COLD))
		strcat(buf, " cold");

	if (IS_SET(imm_flags, IMM_LIGHTNING))
		strcat(buf, " lightning");

	if (IS_SET(imm_flags, IMM_ACID))
		strcat(buf, " acid");

	if (IS_SET(imm_flags, IMM_POISON))
		strcat(buf, " poison");

	if (IS_SET(imm_flags, IMM_NEGATIVE))
		strcat(buf, " negative");

	if (IS_SET(imm_flags, IMM_HOLY))
		strcat(buf, " holy");

	if (IS_SET(imm_flags, IMM_ENERGY))
		strcat(buf, " energy");

	if (IS_SET(imm_flags, IMM_MENTAL))
		strcat(buf, " mental");

	if (IS_SET(imm_flags, IMM_DISEASE))
		strcat(buf, " disease");

	if (IS_SET(imm_flags, IMM_DROWNING))
		strcat(buf, " drowning");

	if (IS_SET(imm_flags, IMM_LIGHT))
		strcat(buf, " light");

	if (IS_SET(imm_flags, IMM_IRON))
		strcat(buf, " iron");

	if (IS_SET(imm_flags, IMM_MITHRIL))
		strcat(buf, " mithril");

	if (IS_SET(imm_flags, IMM_SILVER))
		strcat(buf, " silver");

	if (IS_SET(imm_flags, IMM_SLEEP))
		strcat(buf, " sleep");

	if (IS_SET(imm_flags, IMM_SOUND))
		strcat(buf, " sound");

	if (IS_SET(imm_flags, IMM_INTERNAL))

		strcat(buf, " internal");
	return (buf[0] != '\0') ? buf + 1 : (char *)"none";
}